

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O1

void __thiscall Rml::FontEffectGlowInstancer::FontEffectGlowInstancer(FontEffectGlowInstancer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  PropertyId PVar5;
  PropertyDefinition *pPVar6;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectGlowInstancer_00336c20;
  this->id_width_outline = Invalid;
  this->id_width_blur = Invalid;
  this->id_color = Invalid;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"width-outline","");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"1px","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,true);
  paVar3 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"length","");
  paVar4 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_width_outline = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"width-blur","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"-1px","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,true);
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"length","");
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_width_blur = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"offset-x","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"0px","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,true);
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"length","");
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_offset_x = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"offset-y","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"0px","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,true);
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"length","");
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_offset_y = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"color","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"white","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,false);
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"color","");
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_color = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"font-effect","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"width-outline, width-blur, offset-x, offset-y, color","");
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_90,&local_b0,FallThrough);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FontEffectGlowInstancer::FontEffectGlowInstancer() :
	id_width_outline(PropertyId::Invalid), id_width_blur(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_width_outline = RegisterProperty("width-outline", "1px", true).AddParser("length").GetId();
	id_width_blur = RegisterProperty("width-blur", "-1px", true).AddParser("length").GetId();
	id_offset_x = RegisterProperty("offset-x", "0px", true).AddParser("length").GetId();
	id_offset_y = RegisterProperty("offset-y", "0px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("font-effect", "width-outline, width-blur, offset-x, offset-y, color", ShorthandType::FallThrough);
}